

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O2

bool __thiscall
GGSock::Unserialize::operator()
          (Unserialize *this,vector<char,_std::allocator<char>_> *t,char *bufferData,
          size_t bufferSize,size_t *offset)

{
  uint in_EAX;
  int i;
  long lVar1;
  int32_t n;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  operator()(this,(int32_t *)((long)&uStack_38 + 4),bufferData,bufferSize,offset);
  std::vector<char,_std::allocator<char>_>::resize(t,(long)uStack_38._4_4_);
  for (lVar1 = 0; lVar1 < uStack_38._4_4_; lVar1 = lVar1 + 1) {
    operator()(this,(t->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_start + lVar1,bufferData,bufferSize,offset);
  }
  return true;
}

Assistant:

bool Unserialize::operator()(std::vector<T> & t, const char * bufferData, size_t bufferSize, size_t & offset) {
    bool res = true;

    int32_t n = 0;
    res &= operator()(n, bufferData, bufferSize, offset);

    t.resize(n);
    for (int i = 0; i < n; ++i) {
        res &= operator()(t[i], bufferData, bufferSize, offset);
    }

    return true;
}